

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O3

int32_t ucol_getBound_63(uint8_t *source,int32_t sourceLength,UColBoundMode boundType,
                        uint32_t noOfLevels,uint8_t *result,int32_t resultLength,UErrorCode *status)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int32_t iVar4;
  size_t __n;
  
  iVar4 = 0;
  if ((status != (UErrorCode *)0x0) && (iVar4 = 0, *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (source == (uint8_t *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      uVar1 = 0;
      do {
        uVar3 = uVar1;
        noOfLevels = noOfLevels - (source[uVar3 + 1] == '\x01');
        if (noOfLevels == 0) goto LAB_002892b2;
        uVar1 = uVar3 + 1;
      } while ((source[uVar3 + 1] != '\0') || ((long)uVar1 < (long)sourceLength));
      *status = U_SORT_KEY_TOO_SHORT_WARNING;
LAB_002892b2:
      iVar2 = (int)uVar3;
      if ((result == (uint8_t *)0x0) || (resultLength < (int)(boundType + iVar2 + 1))) {
        iVar4 = boundType + iVar2 + 2;
      }
      else {
        __n = uVar3 + 1;
        memcpy(result,source,__n);
        if (boundType == UCOL_BOUND_UPPER_LONG) {
          result[uVar3 + 1] = 0xff;
          result[(uVar3 & 0xffffffff) + 2] = 0xff;
          __n = (size_t)(iVar2 + 3);
        }
        else if (boundType == UCOL_BOUND_UPPER) {
          __n = (size_t)(iVar2 + 2);
          result[uVar3 + 1] = '\x02';
        }
        else if (boundType != UCOL_BOUND_LOWER) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
          return 0;
        }
        result[(int)__n] = '\0';
        iVar4 = (int)__n + 1;
      }
    }
  }
  return iVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getBound(const uint8_t       *source,
        int32_t             sourceLength,
        UColBoundMode       boundType,
        uint32_t            noOfLevels,
        uint8_t             *result,
        int32_t             resultLength,
        UErrorCode          *status)
{
    // consistency checks
    if(status == NULL || U_FAILURE(*status)) {
        return 0;
    }
    if(source == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    int32_t sourceIndex = 0;
    // Scan the string until we skip enough of the key OR reach the end of the key
    do {
        sourceIndex++;
        if(source[sourceIndex] == Collation::LEVEL_SEPARATOR_BYTE) {
            noOfLevels--;
        }
    } while (noOfLevels > 0
        && (source[sourceIndex] != 0 || sourceIndex < sourceLength));

    if((source[sourceIndex] == 0 || sourceIndex == sourceLength)
        && noOfLevels > 0) {
            *status = U_SORT_KEY_TOO_SHORT_WARNING;
    }


    // READ ME: this code assumes that the values for boundType
    // enum will not changes. They are set so that the enum value
    // corresponds to the number of extra bytes each bound type
    // needs.
    if(result != NULL && resultLength >= sourceIndex+boundType) {
        uprv_memcpy(result, source, sourceIndex);
        switch(boundType) {
            // Lower bound just gets terminated. No extra bytes
        case UCOL_BOUND_LOWER: // = 0
            break;
            // Upper bound needs one extra byte
        case UCOL_BOUND_UPPER: // = 1
            result[sourceIndex++] = 2;
            break;
            // Upper long bound needs two extra bytes
        case UCOL_BOUND_UPPER_LONG: // = 2
            result[sourceIndex++] = 0xFF;
            result[sourceIndex++] = 0xFF;
            break;
        default:
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        result[sourceIndex++] = 0;

        return sourceIndex;
    } else {
        return sourceIndex+boundType+1;
    }
}